

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.cpp
# Opt level: O2

bool __thiscall zmq::xsub_t::xhas_in(xsub_t *this)

{
  msg_t *msg_;
  bool bVar1;
  byte bVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  char *in_RCX;
  void *in_RDX;
  void *__buf;
  undefined8 in_R8;
  
  bVar1 = true;
  if ((this->_more_recv == false) && (this->_has_message == false)) {
    msg_ = &this->_message;
    while( true ) {
      sVar3 = fq_t::recv(&this->_fq,(int)msg_,in_RDX,(size_t)in_RCX,(int)in_R8);
      if ((int)sVar3 != 0) break;
      if (((this->super_socket_base_t).super_own_t.options.filter != true) ||
         (bVar1 = match(this,msg_), bVar1)) {
        this->_has_message = true;
        return true;
      }
      while (bVar2 = msg_t::flags(msg_), in_RDX = __buf, (bVar2 & 1) != 0) {
        sVar3 = fq_t::recv(&this->_fq,(int)msg_,__buf,(size_t)in_RCX,(int)in_R8);
        if ((int)sVar3 != 0) {
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          in_RCX = 
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xsub.cpp"
          ;
          in_R8 = 0xf7;
          fprintf(_stderr,"%s (%s:%d)\n",pcVar5);
          fflush(_stderr);
          zmq_abort(pcVar5);
        }
      }
    }
    piVar4 = __errno_location();
    if (*piVar4 == 0xb) {
      bVar1 = false;
    }
    else {
      pcVar5 = strerror(*piVar4);
      bVar1 = false;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xsub.cpp"
              ,0xe9);
      fflush(_stderr);
      zmq_abort(pcVar5);
    }
  }
  return bVar1;
}

Assistant:

bool zmq::xsub_t::xhas_in ()
{
    //  There are subsequent parts of the partly-read message available.
    if (_more_recv)
        return true;

    //  If there's already a message prepared by a previous call to zmq_poll,
    //  return straight ahead.
    if (_has_message)
        return true;

    //  TODO: This can result in infinite loop in the case of continuous
    //  stream of non-matching messages.
    while (true) {
        //  Get a message using fair queueing algorithm.
        int rc = _fq.recv (&_message);

        //  If there's no message available, return immediately.
        //  The same when error occurs.
        if (rc != 0) {
            errno_assert (errno == EAGAIN);
            return false;
        }

        //  Check whether the message matches at least one subscription.
        if (!options.filter || match (&_message)) {
            _has_message = true;
            return true;
        }

        //  Message doesn't match. Pop any remaining parts of the message
        //  from the pipe.
        while (_message.flags () & msg_t::more) {
            rc = _fq.recv (&_message);
            errno_assert (rc == 0);
        }
    }
}